

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despacer.c
# Opt level: O3

size_t despace_avx2_vpermd(void *dst_void,void *src_void,size_t length)

{
  undefined1 auVar1 [32];
  byte bVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  uint8_t *dst_1;
  long lVar7;
  long lVar8;
  byte *pbVar9;
  size_t sVar10;
  uint8_t *dst;
  ulong uVar11;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 in_ZMM3 [64];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  long lVar22;
  undefined1 auVar23 [32];
  undefined1 auVar12 [32];
  
  auVar6 = _DAT_00195320;
  pbVar9 = (byte *)dst_void;
  if (0x1f < length) {
    auVar14[8] = 0x70;
    auVar14._0_8_ = 0x7070707070707070;
    auVar14[9] = 0x70;
    auVar14[10] = 0x70;
    auVar14[0xb] = 0x70;
    auVar14[0xc] = 0x70;
    auVar14[0xd] = 0x70;
    auVar14[0xe] = 0x70;
    auVar14[0xf] = 0x70;
    auVar14[0x10] = 0x70;
    auVar14[0x11] = 0x70;
    auVar14[0x12] = 0x70;
    auVar14[0x13] = 0x70;
    auVar14[0x14] = 0x70;
    auVar14[0x15] = 0x70;
    auVar14[0x16] = 0x70;
    auVar14[0x17] = 0x70;
    auVar14[0x18] = 0x70;
    auVar14[0x19] = 0x70;
    auVar14[0x1a] = 0x70;
    auVar14[0x1b] = 0x70;
    auVar14[0x1c] = 0x70;
    auVar14[0x1d] = 0x70;
    auVar14[0x1e] = 0x70;
    auVar14[0x1f] = 0x70;
    auVar15[8] = 0x20;
    auVar15._0_8_ = 0x2020202020202020;
    auVar15[9] = 0x20;
    auVar15[10] = 0x20;
    auVar15[0xb] = 0x20;
    auVar15[0xc] = 0x20;
    auVar15[0xd] = 0x20;
    auVar15[0xe] = 0x20;
    auVar15[0xf] = 0x20;
    auVar15[0x10] = 0x20;
    auVar15[0x11] = 0x20;
    auVar15[0x12] = 0x20;
    auVar15[0x13] = 0x20;
    auVar15[0x14] = 0x20;
    auVar15[0x15] = 0x20;
    auVar15[0x16] = 0x20;
    auVar15[0x17] = 0x20;
    auVar15[0x18] = 0x20;
    auVar15[0x19] = 0x20;
    auVar15[0x1a] = 0x20;
    auVar15[0x1b] = 0x20;
    auVar15[0x1c] = 0x20;
    auVar15[0x1d] = 0x20;
    auVar15[0x1e] = 0x20;
    auVar15[0x1f] = 0x20;
    auVar16._16_16_ = _DAT_00195260;
    auVar16._0_16_ = _DAT_00195260;
    auVar17._8_8_ = 0x80a0908884828180;
    auVar17._0_8_ = 0x80a0908884828180;
    auVar17._16_8_ = 0x80a0908884828180;
    auVar17._24_8_ = 0x80a0908884828180;
    auVar18._8_8_ = 0x20100800000000;
    auVar18._0_8_ = 0x20100800000000;
    auVar18._16_8_ = 0x20100800000000;
    auVar18._24_8_ = 0x20100800000000;
    auVar19._8_8_ = 0x8080808;
    auVar19._0_8_ = 0x8080808;
    auVar19._16_8_ = 0x8080808;
    auVar19._24_8_ = 0x8080808;
    auVar20._16_16_ = _DAT_00195280;
    auVar20._0_16_ = _DAT_00195280;
    auVar5 = vpcmpeqd_avx2(in_ZMM3._0_32_,in_ZMM3._0_32_);
    do {
      auVar1 = *src_void;
      src_void = (void *)((long)src_void + 0x20);
      length = length - 0x20;
      auVar21 = vpaddusb_avx2(auVar1,auVar14);
      uVar11 = vpcmpeqb_avx512vl(auVar1,auVar15);
      auVar21 = vpshufb_avx2(auVar16,auVar21);
      auVar12 = vmovdqu8_avx512vl(auVar5);
      bVar4 = (bool)((byte)uVar11 & 1);
      auVar13[0] = bVar4 * auVar12[0] | !bVar4 * auVar21[0];
      bVar4 = (bool)((byte)(uVar11 >> 1) & 1);
      auVar13[1] = bVar4 * auVar12[1] | !bVar4 * auVar21[1];
      bVar4 = (bool)((byte)(uVar11 >> 2) & 1);
      auVar13[2] = bVar4 * auVar12[2] | !bVar4 * auVar21[2];
      bVar4 = (bool)((byte)(uVar11 >> 3) & 1);
      auVar13[3] = bVar4 * auVar12[3] | !bVar4 * auVar21[3];
      bVar4 = (bool)((byte)(uVar11 >> 4) & 1);
      auVar13[4] = bVar4 * auVar12[4] | !bVar4 * auVar21[4];
      bVar4 = (bool)((byte)(uVar11 >> 5) & 1);
      auVar13[5] = bVar4 * auVar12[5] | !bVar4 * auVar21[5];
      bVar4 = (bool)((byte)(uVar11 >> 6) & 1);
      auVar13[6] = bVar4 * auVar12[6] | !bVar4 * auVar21[6];
      bVar4 = (bool)((byte)(uVar11 >> 7) & 1);
      auVar13[7] = bVar4 * auVar12[7] | !bVar4 * auVar21[7];
      bVar4 = (bool)((byte)(uVar11 >> 8) & 1);
      auVar13[8] = bVar4 * auVar12[8] | !bVar4 * auVar21[8];
      bVar4 = (bool)((byte)(uVar11 >> 9) & 1);
      auVar13[9] = bVar4 * auVar12[9] | !bVar4 * auVar21[9];
      bVar4 = (bool)((byte)(uVar11 >> 10) & 1);
      auVar13[10] = bVar4 * auVar12[10] | !bVar4 * auVar21[10];
      bVar4 = (bool)((byte)(uVar11 >> 0xb) & 1);
      auVar13[0xb] = bVar4 * auVar12[0xb] | !bVar4 * auVar21[0xb];
      bVar4 = (bool)((byte)(uVar11 >> 0xc) & 1);
      auVar13[0xc] = bVar4 * auVar12[0xc] | !bVar4 * auVar21[0xc];
      bVar4 = (bool)((byte)(uVar11 >> 0xd) & 1);
      auVar13[0xd] = bVar4 * auVar12[0xd] | !bVar4 * auVar21[0xd];
      bVar4 = (bool)((byte)(uVar11 >> 0xe) & 1);
      auVar13[0xe] = bVar4 * auVar12[0xe] | !bVar4 * auVar21[0xe];
      bVar4 = (bool)((byte)(uVar11 >> 0xf) & 1);
      auVar13[0xf] = bVar4 * auVar12[0xf] | !bVar4 * auVar21[0xf];
      bVar4 = (bool)((byte)(uVar11 >> 0x10) & 1);
      auVar13[0x10] = bVar4 * auVar12[0x10] | !bVar4 * auVar21[0x10];
      bVar4 = (bool)((byte)(uVar11 >> 0x11) & 1);
      auVar13[0x11] = bVar4 * auVar12[0x11] | !bVar4 * auVar21[0x11];
      bVar4 = (bool)((byte)(uVar11 >> 0x12) & 1);
      auVar13[0x12] = bVar4 * auVar12[0x12] | !bVar4 * auVar21[0x12];
      bVar4 = (bool)((byte)(uVar11 >> 0x13) & 1);
      auVar13[0x13] = bVar4 * auVar12[0x13] | !bVar4 * auVar21[0x13];
      bVar4 = (bool)((byte)(uVar11 >> 0x14) & 1);
      auVar13[0x14] = bVar4 * auVar12[0x14] | !bVar4 * auVar21[0x14];
      bVar4 = (bool)((byte)(uVar11 >> 0x15) & 1);
      auVar13[0x15] = bVar4 * auVar12[0x15] | !bVar4 * auVar21[0x15];
      bVar4 = (bool)((byte)(uVar11 >> 0x16) & 1);
      auVar13[0x16] = bVar4 * auVar12[0x16] | !bVar4 * auVar21[0x16];
      bVar4 = (bool)((byte)(uVar11 >> 0x17) & 1);
      auVar13[0x17] = bVar4 * auVar12[0x17] | !bVar4 * auVar21[0x17];
      bVar4 = (bool)((byte)(uVar11 >> 0x18) & 1);
      auVar13[0x18] = bVar4 * auVar12[0x18] | !bVar4 * auVar21[0x18];
      bVar4 = (bool)((byte)(uVar11 >> 0x19) & 1);
      auVar13[0x19] = bVar4 * auVar12[0x19] | !bVar4 * auVar21[0x19];
      bVar4 = (bool)((byte)(uVar11 >> 0x1a) & 1);
      auVar13[0x1a] = bVar4 * auVar12[0x1a] | !bVar4 * auVar21[0x1a];
      bVar4 = (bool)((byte)(uVar11 >> 0x1b) & 1);
      auVar13[0x1b] = bVar4 * auVar12[0x1b] | !bVar4 * auVar21[0x1b];
      bVar4 = (bool)((byte)(uVar11 >> 0x1c) & 1);
      auVar13[0x1c] = bVar4 * auVar12[0x1c] | !bVar4 * auVar21[0x1c];
      bVar4 = (bool)((byte)(uVar11 >> 0x1d) & 1);
      auVar13._30_2_ = auVar12._30_2_;
      auVar13[0x1d] = bVar4 * auVar12[0x1d] | !bVar4 * auVar21[0x1d];
      auVar12 = vpandn_avx2(auVar13,auVar17);
      auVar21 = vpand_avx2(auVar13,auVar19);
      auVar12 = vpsadbw_avx2(auVar12,auVar18);
      auVar13 = vpsadbw_avx2(auVar21,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
      auVar21 = vpsllq_avx2(auVar12,0x1d);
      auVar23 = vpsrlq_avx2(auVar12,7);
      auVar21 = vpor_avx2(auVar21,auVar12);
      lVar22 = auVar23._0_8_;
      auVar21 = vpermd_avx2(auVar21,auVar6);
      auVar21 = vpsrlvq_avx2(auVar21 ^ auVar20,auVar13);
      auVar1 = vpshufb_avx2(auVar1,auVar21);
      *(long *)pbVar9 = auVar1._0_8_;
      uVar3 = vpextrq_avx(auVar1._0_16_,1);
      *(undefined8 *)(pbVar9 + lVar22) = uVar3;
      lVar7 = vpextrq_avx(auVar23._0_16_,1);
      *(long *)(pbVar9 + lVar7 + lVar22) = auVar1._16_8_;
      lVar8 = vpextrq_avx(auVar23._16_16_,1);
      uVar3 = vpextrq_avx(auVar1._16_16_,1);
      *(undefined8 *)(pbVar9 + auVar23._16_8_ + lVar7 + lVar22) = uVar3;
      pbVar9 = pbVar9 + lVar8 + auVar23._16_8_ + lVar7 + lVar22;
    } while (0x1f < length);
  }
  if (length != 0) {
    sVar10 = 0;
    do {
      bVar2 = (*(undefined1 (*) [32])src_void)[sVar10];
      *pbVar9 = bVar2;
      if (((ulong)bVar2 < 0x21) && ((0x100002400U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
        uVar11 = 0;
      }
      else {
        uVar11 = (ulong)(bVar2 != 9);
      }
      pbVar9 = pbVar9 + uVar11;
      sVar10 = sVar10 + 1;
    } while (length != sVar10);
  }
  return (long)pbVar9 - (long)dst_void;
}

Assistant:

size_t despace_avx2_vpermd( void* dst_void, void* src_void, size_t length )
{
	uint8_t* src = (uint8_t*)src_void;
	uint8_t* dst = (uint8_t*)dst_void;

	const __m256i mask_20  = _mm256_set1_epi8( 0x20 );
	const __m256i mask_70  = _mm256_set1_epi8( 0x70 );
	const __m256i lut_cntrl = _mm256_setr_epi8(
		0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
		0x00, 0xFF, 0xFF, 0x00, 0x00, 0xFF, 0x00, 0x00,
		//
		0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
		0x00, 0xFF, 0xFF, 0x00, 0x00, 0xFF, 0x00, 0x00
	);

	const __m256i mask_index = _mm256_set1_epi64x( 0x80A0908884828180 );
	const __m256i mask_shift = _mm256_set1_epi64x( 0x0000000008080808 );
	const __m256i mask_invert = _mm256_set1_epi64x( 0x0020100800000000 );
	const __m256i mask_fixup = _mm256_set_epi32(
		0x08080808, 0x0F0F0F0F, 0x00000000, 0x07070707,
		0x08080808, 0x0F0F0F0F, 0x00000000, 0x07070707
	);
	const __m256i lut = _mm256_set_epi32(
		0x04050607, // 0x03020100', 0x000000'07
		0x04050704, // 0x030200'00, 0x0000'0704
		0x04060705, // 0x030100'00, 0x0000'0705
		0x04070504, // 0x0300'0000, 0x00'070504
		0x05060706, // 0x020100'00, 0x0000'0706
		0x05070604, // 0x0200'0000, 0x00'070604
		0x06070605, // 0x0100'0000, 0x00'070605
		0x07060504  // 0x00'000000, 0x'07060504
	);

	for( ; length >= 32; length-=32 ){
		__m256i r0,r1,r2,r3,r4;

		r0 = _mm256_loadu_si256((__m256i *)src); // asrc
		src += 32;

		r1 = _mm256_adds_epu8(mask_70, r0);
		r2 = _mm256_cmpeq_epi8(mask_20, r0);
		r1 = _mm256_shuffle_epi8(lut_cntrl, r1);
		r1 = _mm256_or_si256(r1, r2); // bytemask of spaces

		r2 = _mm256_andnot_si256(r1, mask_index);
		r1 = _mm256_and_si256(r1, mask_shift);
		r2 = _mm256_sad_epu8(r2, mask_invert); // bitmap[0:5], popcnt[7:15]
		r1 = _mm256_sad_epu8(r1, _mm256_setzero_si256()); // shift amount
		r3 = _mm256_slli_epi64(r2, 29); // move hi index to 2nd dword
		r4 = _mm256_srli_epi64(r2, 7); // popcnt
		r2 = _mm256_or_si256(r2, r3);
		r2 = _mm256_permutevar8x32_epi32(lut, r2);
		r2 = _mm256_xor_si256(r2, mask_fixup);
		r2 = _mm256_srlv_epi64(r2, r1);
		r0 = _mm256_shuffle_epi8(r0, r2);

		*((uint64_t*)dst) = _mm256_extract_epi64(r0, 0);
		dst += _mm256_extract_epi64(r4, 0);
		*((uint64_t*)dst) = _mm256_extract_epi64(r0, 1);
		dst += _mm256_extract_epi64(r4, 1);
		*((uint64_t*)dst) = _mm256_extract_epi64(r0, 2);
		dst += _mm256_extract_epi64(r4, 2);
		*((uint64_t*)dst) = _mm256_extract_epi64(r0, 3);
		dst += _mm256_extract_epi64(r4, 3);
	}
	dst += despace_branchless(dst, src, length);
	return (size_t)(dst - ((uint8_t*)dst_void));
}